

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonsugar.hpp
# Opt level: O2

void __thiscall
nonsugar::detail::parse_flag_long<std::__cxx11::string,boost::optional<int>,void>::operator()
          (parse_flag_long<std::__cxx11::string,boost::optional<int>,void> *this,
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *match,__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *param_2,
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          param_3,shared_ptr<boost::optional<int>_> *value,
          flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__e_,_boost::optional<int>_>
          *flg,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *err)

{
  string_type *psVar1;
  const_reference pvVar2;
  char *s;
  string_type local_90;
  shared_ptr<int> v;
  string local_60;
  string_type local_40;
  
  pvVar2 = std::__cxx11::
           match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator[](match,2);
  if (pvVar2->matched == false) {
    std::make_shared<boost::optional<int>>();
    std::__shared_ptr<boost::optional<int>,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&value->super___shared_ptr<boost::optional<int>,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<boost::optional<int>,_(__gnu_cxx::_Lock_policy)2> *)&local_90);
    psVar1 = &local_90;
  }
  else {
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(&local_90,match,2);
    std::
    function<std::shared_ptr<int>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()((function<std::shared_ptr<int>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &flg->read);
    std::__cxx11::string::~string((string *)&local_90);
    if (v.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0) {
      widen<std::__cxx11::string>(&local_60,(detail *)"invalid argument: ",s);
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str(&local_40,match,0);
      std::operator+(&local_90,&local_60,&local_40);
      std::__cxx11::string::operator=((string *)err,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_60);
    }
    else {
      local_60._M_dataplus._M_p =
           (pointer)(((ulong)(uint)*v.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr <<
                     0x20) + 1);
      std::make_shared<boost::optional<int>,boost::optional<int>const&>((optional<int> *)&local_90);
      std::__shared_ptr<boost::optional<int>,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&value->super___shared_ptr<boost::optional<int>,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<boost::optional<int>,_(__gnu_cxx::_Lock_policy)2> *)&local_90);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_90._M_string_length);
    }
    psVar1 = (string_type *)&v.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&psVar1->_M_string_length);
  return;
}

Assistant:

void operator()(
        std::match_results<typename String::const_iterator> const &match, Iterator &, Iterator,
        std::shared_ptr<Value> &value, Flag const &flg, String &err) const
    {
        if (!match[2].matched) {
            value = std::make_shared<Value>();
        } else {
            auto const v = flg.read(match.str(2));
            if (!v) {
                err = widen<String>("invalid argument: ") + match.str(0);
                return;
            }
            value = copy_shared(optional_traits<Value>::construct(*v));
        }
    }